

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_setup_conn(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  
  Curl_conncontrol(conn,0);
  if (((data->state).httpwant == '\x1f') &&
     (CVar1 = Curl_conn_may_http3(data,conn), CVar1 != CURLE_OK)) {
    return CVar1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_setup_conn(struct Curl_easy *data,
                              struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  connkeep(conn, "HTTP default");

  if(data->state.httpwant == CURL_HTTP_VERSION_3ONLY) {
    CURLcode result = Curl_conn_may_http3(data, conn);
    if(result)
      return result;
  }

  return CURLE_OK;
}